

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxskin.cpp
# Opt level: O0

void rw::xbox::skinUninstanceCB(Geometry *geo,InstanceDataHeader *header)

{
  void *pvVar1;
  uint8 *puVar2;
  float *__src;
  Skin *this;
  int iVar3;
  int local_94;
  int local_90;
  int32 j_3;
  int32 j_2;
  int32 j_1;
  uint16 *ip;
  float local_78;
  uint8 i [4];
  float w [4];
  int local_5c;
  ushort *puStack_58;
  int32 numVertices;
  uint8 *p;
  uint8 *indices;
  float *weights;
  int32 j;
  float *invMats;
  uint8 *data;
  NativeSkin *natskin;
  Skin *skin;
  InstanceDataHeader *header_local;
  Geometry *geo_local;
  
  defaultUninstanceCB(geo,header);
  this = Skin::get(geo);
  if (this != (Skin *)0x0) {
    pvVar1 = this->platformData;
    puVar2 = this->data;
    __src = this->inverseMatrices;
    Skin::init(this,(EVP_PKEY_CTX *)(ulong)(uint)this->numBones);
    memcpy(this->inverseMatrices,__src,(long)(this->numBones << 6));
    (*DAT_00168638)(puVar2);
    for (weights._4_4_ = 0; weights._4_4_ < this->numUsedBones; weights._4_4_ = weights._4_4_ + 1) {
      this->usedBones[weights._4_4_] =
           (uint8)*(undefined4 *)((long)pvVar1 + (long)weights._4_4_ * 4);
    }
    indices = (uint8 *)this->weights;
    p = this->indices;
    puStack_58 = *(ushort **)((long)pvVar1 + 0x808);
    local_5c = header->numVertices;
    while (iVar3 = local_5c + -1, local_5c != 0) {
      i[0] = '\0';
      i[1] = '\0';
      i[2] = '\0';
      i[3] = '\0';
      local_78 = 0.0;
      ip._7_1_ = 0;
      ip._6_1_ = 0;
      ip._5_1_ = 0;
      ip._4_1_ = 0;
      for (j_3 = 0; j_3 < this->numWeights; j_3 = j_3 + 1) {
        *(float *)(i + (long)j_3 * 4 + -4) = (float)(byte)*puStack_58 / 255.0;
        puStack_58 = (ushort *)((long)puStack_58 + 1);
      }
      _j_2 = puStack_58;
      for (local_90 = 0; local_90 < this->numWeights; local_90 = local_90 + 1) {
        *(char *)((long)&ip + (long)local_90 + 4) =
             (char)*(undefined4 *)((long)pvVar1 + (long)(int)(*_j_2 / 3) * 4);
        if ((*(float *)(i + (long)local_90 * 4 + -4) == 0.0) &&
           (!NAN(*(float *)(i + (long)local_90 * 4 + -4)))) {
          *(undefined1 *)((long)&ip + (long)local_90 + 4) = 0;
        }
        _j_2 = _j_2 + 1;
      }
      puStack_58 = _j_2;
      for (local_94 = 0; local_5c = iVar3, local_94 < 4; local_94 = local_94 + 1) {
        *(undefined4 *)indices = *(undefined4 *)(i + (long)local_94 * 4 + -4);
        *p = *(uint8 *)((long)&ip + (long)local_94 + 4);
        p = p + 1;
        indices = indices + 4;
      }
    }
    (*DAT_00168638)(*(undefined8 *)((long)pvVar1 + 0x808));
    (*DAT_00168638)(pvVar1);
  }
  return;
}

Assistant:

void
skinUninstanceCB(Geometry *geo, InstanceDataHeader *header)
{
	defaultUninstanceCB(geo, header);

	Skin *skin = Skin::get(geo);
	if(skin == nil)
		return;
	NativeSkin *natskin = (NativeSkin*)skin->platformData;

	uint8 *data = skin->data;
	float *invMats = skin->inverseMatrices;
	skin->init(skin->numBones, natskin->numUsedBones, geo->numVertices);
	memcpy(skin->inverseMatrices, invMats, skin->numBones*64);
	rwFree(data);

	for(int32 j = 0; j < skin->numUsedBones; j++)
		skin->usedBones[j] = natskin->table1[j];

	float *weights = skin->weights;
	uint8 *indices = skin->indices;
	uint8 *p = (uint8*)natskin->vertexBuffer;
	int32 numVertices = header->numVertices;
	float w[4];
	uint8 i[4];
	uint16 *ip;
	while(numVertices--){
		w[0] = w[1] = w[2] = w[3] = 0.0f;
		i[0] = i[1] = i[2] = i[3] = 0;

		for(int32 j = 0; j < skin->numWeights; j++)
			w[j] = *p++/255.0f;

		ip = (uint16*)p;
		for(int32 j = 0; j < skin->numWeights; j++){
			i[j] = natskin->table1[*ip++/3];
			if(w[j] == 0.0f) i[j] = 0;	// clean up a bit
		}
		p = (uint8*)ip;

		for(int32 j = 0; j < 4; j++){
			*weights++ = w[j];
			*indices++ = i[j];
		}
	}

	rwFree(natskin->vertexBuffer);
	rwFree(natskin);
}